

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::start_upnp
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *s)

{
  _Atomic_word *p_Var1;
  io_context *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Atomic_word _Var5;
  undefined1 local_41;
  bad_address_cast ex;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  address_v4 local_30;
  address_v4 local_2c;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  ex = (bad_address_cast)
       (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((((endpoint *)((long)ex + 0x70))->impl_).data_.base.sa_family != 2) {
    return;
  }
  if ((((listen_socket_flags_t *)((long)ex + 0xf5))->m_val & 10) != 0) {
    return;
  }
  if ((((shared_ptr<libtorrent::upnp> *)((long)ex + 0x1e0))->
      super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  __args = this->m_io_context;
  local_2c.addr_.s_addr = *(in4_addr_type *)((long)ex + 0x74);
  if (((address *)((long)ex + 0x90))->type_ != ipv4) {
    ex = (bad_address_cast)&PTR__bad_cast_004decf0;
    boost::throw_exception<boost::asio::ip::bad_address_cast>(&ex);
  }
  local_30.addr_.s_addr = (in4_addr_type)(((address_v4 *)((long)ex + 0x94))->addr_).s_addr;
  this_00 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_38._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_weak_count = this_00->_M_weak_count + 1;
        UNLOCK();
        goto LAB_002c0670;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_weak_count = this_00->_M_weak_count + 1;
  }
LAB_002c0670:
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::upnp>,boost::asio::io_context&,libtorrent::aux::session_settings&,libtorrent::aux::session_impl&,boost::asio::ip::address_v4,boost::asio::ip::address_v4,std::__cxx11::string&,libtorrent::aux::listen_socket_handle>
            ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (allocator<libtorrent::upnp> *)&local_41,__args,&this->m_settings,this,&local_2c,
             &local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)ex + 0xb0),
             (listen_socket_handle *)&ex);
  p_Var4 = p_Stack_20;
  peVar3 = local_28;
  peVar2 = (s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (peVar2->upnp_mapper).super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (peVar2->upnp_mapper).super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  (peVar2->upnp_mapper).super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var4;
  if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
     p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38._M_pi)->_M_weak_count;
      _Var5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      _Var5 = (local_38._M_pi)->_M_weak_count;
      (local_38._M_pi)->_M_weak_count = _Var5 + -1;
    }
    if (_Var5 == 1) {
      (*(local_38._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  upnp::start((((s->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->upnp_mapper).
              super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void session_impl::start_upnp(std::shared_ptr<aux::listen_socket_t> const& s)
	{
		// until we support SSDP over an IPv6 network (
		// https://en.wikipedia.org/wiki/Simple_Service_Discovery_Protocol )
		// there's no point in starting upnp on one.
		if (is_v6(s->local_endpoint))
			return;

		// there's no point in starting the UPnP mapper for a network that isn't
		// connected to the internet. The whole point is to forward ports through
		// the gateway
		if ((s->flags & listen_socket_t::local_network)
			|| (s->flags & listen_socket_t::proxy))
			return;

		if (!s->upnp_mapper)
		{
			// the upnp constructor may fail and call the callbacks
			// into the session_impl.
			s->upnp_mapper = std::make_shared<upnp>(m_io_context, m_settings
				, *this, s->local_endpoint.address().to_v4(), s->netmask.to_v4(), s->device
				, listen_socket_handle(s));
			s->upnp_mapper->start();
		}
	}